

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_eng.c
# Opt level: O0

int gost_engine_destroy(ENGINE *e)

{
  gost_meth_minfo *minfo;
  int i;
  gost_meth_minfo *local_18;
  uint local_c;
  
  for (local_c = 0; local_c < 8; local_c = local_c + 1) {
    GOST_deinit_digest((GOST_digest *)0x10e4c1);
  }
  for (local_c = 0; local_c < 0x14; local_c = local_c + 1) {
    GOST_deinit_cipher((GOST_cipher *)0x10e4f6);
  }
  gost_param_free();
  for (local_18 = gost_meth_array; local_18->nid != 0; local_18 = local_18 + 1) {
    *local_18->pmeth = (EVP_PKEY_METHOD *)0x0;
    *local_18->ameth = (EVP_PKEY_ASN1_METHOD *)0x0;
  }
  free_cached_groups();
  free_NIDs();
  ERR_unload_GOST_strings();
  return 1;
}

Assistant:

static int gost_engine_destroy(ENGINE* e) {
    int i;

    for (i = 0; i < OSSL_NELEM(gost_digest_array); i++)
        GOST_deinit_digest(gost_digest_array[i]);
    for (i = 0; i < OSSL_NELEM(gost_cipher_array); i++)
        GOST_deinit_cipher(gost_cipher_array[i]);

    gost_param_free();

    struct gost_meth_minfo *minfo = gost_meth_array;
    for (; minfo->nid; minfo++) {
        *minfo->pmeth = NULL;
        *minfo->ameth = NULL;
    }

    free_cached_groups();
    free_NIDs();

# ifndef BUILDING_GOST_PROVIDER
    ERR_unload_GOST_strings();
# endif

    return 1;
}